

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_add_validation
              (cargo_t ctx,cargo_validation_flags_t flags,char *opt,cargo_validation_t *vd)

{
  int iVar1;
  cargo_opt_t *o;
  size_t opt_i;
  cargo_validation_t *vd_local;
  size_t name_i;
  
  vd_local = vd;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1aa0,
                  "int cargo_add_validation(cargo_t, cargo_validation_flags_t, const char *, cargo_validation_t *)"
                 );
  }
  if (opt != (char *)0x0) {
    if (vd != (cargo_validation_t *)0x0) {
      if ((vd->validator != (cargo_validation_f)0x0) &&
         (iVar1 = _cargo_find_option_name(ctx,opt,&opt_i,&name_i), iVar1 == 0)) {
        if ((ctx->options[opt_i].type & vd->types) != 0) {
          o = ctx->options + opt_i;
          _cargo_option_destroy_validation(o);
          vd->ref_count = vd->ref_count + 1;
          o->validation = vd;
          o->validation_flags = flags;
          return 0;
        }
      }
      _cargo_free_validation(&vd_local);
    }
    return -1;
  }
  __assert_fail("opt",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1aa1,
                "int cargo_add_validation(cargo_t, cargo_validation_flags_t, const char *, cargo_validation_t *)"
               );
}

Assistant:

int cargo_add_validation(cargo_t ctx, cargo_validation_flags_t flags,
                        const char *opt, cargo_validation_t *vd)
{
    size_t opt_i;
    size_t name_i;
    cargo_opt_t *o;
    assert(ctx);
    assert(opt);

    if (!vd)
    {
        CARGODBG(1, "Got NULL validation for options \"%s\"\n", opt);
        return -1;
    }

    if (!(vd->validator))
    {
        CARGODBG(1, "Validation missing validator function for \"%s\"\n", opt);
        goto fail;
    }

    if (_cargo_find_option_name(ctx, opt, &opt_i, &name_i))
    {
        CARGODBG(1, "Failed to find option \"%s\"\n", opt);
        goto fail;
    }

    o = &ctx->options[opt_i];

    if (!(o->type & vd->types))
    {
        CARGODBG(1, "\"%s\" of type \"%s\" is not supported by the validation %s\n",
                opt, _cargo_type_to_str(o->type), vd->name);
        goto fail;
    }

    // Remove current validation.
    _cargo_option_destroy_validation(o);

    // We have a reference count so that
    // multiple options can use the same validation.
    vd->ref_count++;
    o->validation = vd;
    o->validation_flags = flags;

    return 0;
fail:
    _cargo_free_validation(&vd);
    return -1;
}